

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O2

shared_ptr<gui::Button> __thiscall gui::DialogBox::getOptionButton(DialogBox *this,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<gui::Button> sVar1;
  
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)(index + 0x250) - *(long *)(index + 0x248) >> 4)) {
    std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)(index + 0x248) + (long)in_RDX._M_pi * 0x10));
    in_RDX._M_pi = extraout_RDX;
  }
  else {
    (this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase = (_func_int **)0x0;
    (this->super_Group).super_Container.super_ContainerBase.children_.
    super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  sVar1.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi
  ;
  sVar1.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<gui::Button>)sVar1.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Button> DialogBox::getOptionButton(size_t index) const {
    if (index < optionButtons_.size()) {
        return optionButtons_[index];
    }
    return nullptr;
}